

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# di.hpp
# Opt level: O2

shared<boost::ext::di::v1_3_0::scopes::singleton,_complex3,_std::shared_ptr<complex3>_&> __thiscall
boost::ext::di::v1_3_0::scopes::singleton::
scope_impl<complex3,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>>::
create_impl<complex3,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<complex3,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::any_type_1st_fwd<complex3>>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::detail::injector<boost::ext::di::v1_3_0::config,int,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,boost::ext::di::v1_3_0::aux::type_list<complex2>,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,complex2>,boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,std::shared_ptr<complex2>>>,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>>>>
          (scope_impl<complex3,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>> *this,
          provider<boost::ext::di::v1_3_0::aux::pair<complex3,_boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::any_type_1st_fwd<complex3>_>_>_>,_boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::detail::injector<boost::ext::di::v1_3_0::config,_int,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_boost::ext::di::v1_3_0::aux::type_list<complex2>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,_complex2>,_boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,_std::shared_ptr<complex2>_>_>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>_>_>
          *provider)

{
  int iVar1;
  complex3 *__p;
  heap local_9;
  
  if (create_impl<complex3,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<complex3,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::any_type_1st_fwd<complex3>>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::detail::injector<boost::ext::di::v1_3_0::config,int,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,boost::ext::di::v1_3_0::aux::type_list<complex2>,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,complex2>,boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,std::shared_ptr<complex2>>>,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>>>>(boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<complex3,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::any_type_1st_fwd<complex3>>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::detail::injector<boost::ext::di::v1_3_0::config,int,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,boost::ext::di::v1_3_0::aux::type_list<complex2>,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,complex2>,boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,std::shared_ptr<complex2>>>,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>>>const&)
      ::object == '\0') {
    iVar1 = __cxa_guard_acquire(&create_impl<complex3,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<complex3,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::any_type_1st_fwd<complex3>>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::detail::injector<boost::ext::di::v1_3_0::config,int,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,boost::ext::di::v1_3_0::aux::type_list<complex2>,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,complex2>,boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,std::shared_ptr<complex2>>>,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>>>>(boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<complex3,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::any_type_1st_fwd<complex3>>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::detail::injector<boost::ext::di::v1_3_0::config,int,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,boost::ext::di::v1_3_0::aux::type_list<complex2>,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,complex2>,boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,std::shared_ptr<complex2>>>,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>>>const&)
                                 ::object);
    if (iVar1 != 0) {
      __p = core::successful::
            provider<boost::ext::di::v1_3_0::aux::pair<complex3,_boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::any_type_1st_fwd<complex3>_>_>_>,_boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::detail::injector<boost::ext::di::v1_3_0::config,_int,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_boost::ext::di::v1_3_0::aux::type_list<complex2>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,_complex2>,_boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,_std::shared_ptr<complex2>_>_>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>_>_>
            ::get<boost::ext::di::v1_3_0::type_traits::heap>(provider,&local_9);
      std::__shared_ptr<complex3,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<complex3,void>
                ((__shared_ptr<complex3,(__gnu_cxx::_Lock_policy)2> *)
                 &scope_impl<complex3,_boost::ext::di::v1_3_0::aux::integral_constant<bool,_true>_>
                  ::
                  create_impl<complex3,_boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<complex3,_boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::any_type_1st_fwd<complex3>_>_>_>,_boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::detail::injector<boost::ext::di::v1_3_0::config,_int,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_boost::ext::di::v1_3_0::aux::type_list<complex2>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,_complex2>,_boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,_std::shared_ptr<complex2>_>_>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>_>_>_>
                  ::object,__p);
      __cxa_atexit(std::__shared_ptr<complex3,_(__gnu_cxx::_Lock_policy)2>::~__shared_ptr,
                   &scope_impl<complex3,_boost::ext::di::v1_3_0::aux::integral_constant<bool,_true>_>
                    ::
                    create_impl<complex3,_boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<complex3,_boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::any_type_1st_fwd<complex3>_>_>_>,_boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::detail::injector<boost::ext::di::v1_3_0::config,_int,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_boost::ext::di::v1_3_0::aux::type_list<complex2>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,_complex2>,_boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,_std::shared_ptr<complex2>_>_>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>_>_>_>
                    ::object,&__dso_handle);
      __cxa_guard_release(&create_impl<complex3,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<complex3,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::any_type_1st_fwd<complex3>>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::detail::injector<boost::ext::di::v1_3_0::config,int,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,boost::ext::di::v1_3_0::aux::type_list<complex2>,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,complex2>,boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,std::shared_ptr<complex2>>>,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>>>>(boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<complex3,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::any_type_1st_fwd<complex3>>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::detail::injector<boost::ext::di::v1_3_0::config,int,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,boost::ext::di::v1_3_0::aux::type_list<complex2>,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,complex2>,boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,std::shared_ptr<complex2>>>,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>>>const&)
                           ::object);
    }
  }
  return (shared<boost::ext::di::v1_3_0::scopes::singleton,_complex3,_std::shared_ptr<complex3>_&>)
         &scope_impl<complex3,_boost::ext::di::v1_3_0::aux::integral_constant<bool,_true>_>::
          create_impl<complex3,_boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<complex3,_boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::any_type_1st_fwd<complex3>_>_>_>,_boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::detail::injector<boost::ext::di::v1_3_0::config,_int,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_boost::ext::di::v1_3_0::aux::type_list<complex2>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,_complex2>,_boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,_std::shared_ptr<complex2>_>_>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>_>_>_>
          ::object;
}

Assistant:

auto create_impl(const TProvider& provider) {
      static std::shared_ptr<T_> object{provider.get()};
      return wrappers::shared<singleton, T_, std::shared_ptr<T_>&>{object};
    }